

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.cpp
# Opt level: O2

void __thiscall Router::Router(Router *this)

{
  vector<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
  *this_00;
  vector<Vec2,_std::allocator<Vec2>_> *this_01;
  undefined8 uVar1;
  pointer pvVar2;
  pointer pVVar3;
  long lVar4;
  pointer pvVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  int i;
  long lVar9;
  int u;
  long lVar10;
  long lVar11;
  long lVar12;
  float fVar13;
  float fVar14;
  Vec2 t3;
  Vec2 t2;
  Vec2 t1;
  Vec2 t0;
  
  this_00 = &this->Obstacles;
  this_01 = &this->Vertexes;
  (this->Edges).
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Edges).
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Vertexes).super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->Vertexes).super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->Obstacles).
  super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Vertexes).super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->Obstacles).
  super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Obstacles).
  super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Edges).
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->ObstacleCount = 0xb;
  std::
  vector<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
  ::resize(this_00,0xb);
  setObstacle((this_00->
              super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start,0.0,0.0,21.0,7.0);
  setObstacle((this_00->
              super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + 1,15.0,9.0,25.5,17.0);
  setObstacle((this_00->
              super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + 2,0.0,11.0,15.0,22.0);
  setObstacle((this_00->
              super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + 3,0.0,22.0,25.5,29.0);
  setObstacle((this_00->
              super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + 4,31.0,7.0,42.0,28.0);
  setObstacle((this_00->
              super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + 5,42.0,0.0,60.0,52.0);
  setObstacle((this_00->
              super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + 6,22.0,31.0,39.0,48.0);
  setObstacle((this_00->
              super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + 7,0.0,44.0,10.0,54.0);
  setObstacle((this_00->
              super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + 8,0.0,54.0,23.0,90.0);
  setObstacle((this_00->
              super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + 9,27.0,86.0,60.0,90.0);
  setObstacle((this_00->
              super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + 10,37.0,68.0,51.0,82.0);
  lVar11 = 0;
  for (lVar9 = 0; lVar9 < this->ObstacleCount; lVar9 = lVar9 + 1) {
    pvVar2 = (this_00->
             super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar1 = **(undefined8 **)
              ((long)&(pvVar2->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
                      super__Vector_impl_data + lVar11);
    t0.x = (float)uVar1 + -0.05;
    t0.y = (float)((ulong)uVar1 >> 0x20) + -0.05;
    uVar1 = *(undefined8 *)
             (*(long *)((long)&(pvVar2->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
                               super__Vector_impl_data + lVar11) + 8);
    fVar13 = (float)uVar1 + -0.05;
    fVar14 = (float)((ulong)uVar1 >> 0x20) + 0.05;
    t1.y = fVar14;
    t1.x = fVar13;
    uVar1 = *(undefined8 *)
             (*(long *)((long)&(pvVar2->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
                               super__Vector_impl_data + lVar11) + 0x10);
    t2.x = (float)uVar1 + 0.05;
    t2.y = (float)((ulong)uVar1 >> 0x20) + 0.05;
    uVar1 = *(undefined8 *)
             (*(long *)((long)&(pvVar2->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
                               super__Vector_impl_data + lVar11) + 0x18);
    t3.x = (float)uVar1 + 0.05;
    t3.y = (float)((ulong)uVar1 >> 0x20) + -0.05;
    if ((((0.0 <= t0.x) && (t0.x <= 60.0)) && (0.0 <= t0.y)) && (t0.y <= 90.0)) {
      std::vector<Vec2,_std::allocator<Vec2>_>::push_back(this_01,&t0);
      fVar13 = t1.x;
      fVar14 = t1.y;
    }
    if (((0.0 <= fVar13) && (fVar13 <= 60.0)) && ((0.0 <= fVar14 && (fVar14 <= 90.0)))) {
      std::vector<Vec2,_std::allocator<Vec2>_>::push_back(this_01,&t1);
    }
    if (((0.0 <= t2.x) && (t2.x <= 60.0)) && ((0.0 <= t2.y && (t2.y <= 90.0)))) {
      std::vector<Vec2,_std::allocator<Vec2>_>::push_back(this_01,&t2);
    }
    if ((((0.0 <= t3.x) && (t3.x <= 60.0)) && (0.0 <= t3.y)) && (t3.y <= 90.0)) {
      std::vector<Vec2,_std::allocator<Vec2>_>::push_back(this_01,&t3);
    }
    lVar11 = lVar11 + 0x18;
  }
  iVar7 = (int)((ulong)((long)(this->Vertexes).super__Vector_base<Vec2,_std::allocator<Vec2>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->Vertexes).super__Vector_base<Vec2,_std::allocator<Vec2>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3);
  this->VertexCount = iVar7;
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::resize(&this->Edges,(long)iVar7);
  lVar9 = 0;
  lVar11 = 0;
  while( true ) {
    iVar7 = this->VertexCount;
    if (iVar7 <= lVar11) break;
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)
               ((long)&(((this->Edges).
                         super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data + lVar9),(long)iVar7);
    lVar11 = lVar11 + 1;
    lVar9 = lVar9 + 0x18;
  }
  lVar9 = 1;
  lVar11 = 0;
  do {
    if (iVar7 <= lVar11) {
      return;
    }
    for (lVar12 = lVar9; (int)lVar12 < iVar7; lVar12 = lVar12 + 1) {
      for (lVar10 = 0; lVar10 < this->ObstacleCount; lVar10 = lVar10 + 1) {
        lVar8 = 1;
        while (lVar8 != 5) {
          pVVar3 = (this_01->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          lVar4 = *(long *)&(this_00->
                            super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[lVar10].
                            super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
                            super__Vector_impl_data;
          bVar6 = intersect(pVVar3[lVar11],pVVar3[lVar12],*(Vec2 *)(lVar4 + -8 + lVar8 * 8),
                            *(Vec2 *)(lVar4 + (ulong)((uint)lVar8 & 3) * 8));
          lVar8 = lVar8 + 1;
          if (bVar6) {
            fVar13 = 1e+08;
            goto LAB_00106fb0;
          }
        }
      }
      pVVar3 = (this_01->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
               super__Vector_impl_data._M_start;
      fVar13 = pVVar3[lVar11].x - pVVar3[lVar12].x;
      fVar14 = pVVar3[lVar11].y - pVVar3[lVar12].y;
      fVar13 = SQRT(fVar13 * fVar13 + fVar14 * fVar14);
LAB_00106fb0:
      pvVar5 = (this->Edges).
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(float *)(*(long *)&pvVar5[lVar12].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data + lVar11 * 4) = fVar13;
      *(float *)(*(long *)&pvVar5[lVar11].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data + lVar12 * 4) = fVar13;
      iVar7 = this->VertexCount;
    }
    lVar9 = lVar9 + 1;
    lVar11 = lVar11 + 1;
  } while( true );
}

Assistant:

Router::Router()
{
    ObstacleCount = 11;
    Obstacles.resize(ObstacleCount);

    setObstacle(Obstacles[0],  0,  0, 21,  7);
    setObstacle(Obstacles[1], 15,  9, 25.5, 17);
    setObstacle(Obstacles[2],  0, 11, 15, 22);
    setObstacle(Obstacles[3],  0, 22, 25.5, 29);
    setObstacle(Obstacles[4], 31,  7, 42, 28);
    setObstacle(Obstacles[5], 42,  0, 60, 52);
    setObstacle(Obstacles[6], 22, 31, 39, 48);
    setObstacle(Obstacles[7],  0, 44, 10, 54);
    setObstacle(Obstacles[8],  0, 54, 23, 90);
    setObstacle(Obstacles[9], 27, 86, 60, 90);
    setObstacle(Obstacles[10],37, 68, 51, 82);

    for (int i = 0; i < ObstacleCount; ++i)
    {
        Vec2 t0 = Obstacles[i][0] + Vec2(-ObsBorder, -ObsBorder);
        Vec2 t1 = Obstacles[i][1] + Vec2(-ObsBorder, ObsBorder);
        Vec2 t2 = Obstacles[i][2] + Vec2(ObsBorder, ObsBorder);
        Vec2 t3 = Obstacles[i][3] + Vec2(ObsBorder, -ObsBorder);
#define CHECK(t) if (t.x >= 0 && t.x <= MapWidth && t.y >= 0 && t.y <= MapHeight) Vertexes.push_back(t);
        CHECK(t0)
        CHECK(t1)
        CHECK(t2)
        CHECK(t3)
#undef CHECK
    }
    VertexCount = Vertexes.size();
    Edges.resize(VertexCount);
    for (int i = 0; i < VertexCount; ++i)
        Edges[i].resize(VertexCount);
    for (int i = 0; i < VertexCount; ++i)
        for (int j = i + 1; j < VertexCount; ++j)
        {
            bool flag = true;
            for (int u = 0; u < ObstacleCount; ++u)
            {
                for (int v = 0; v < 4; ++v)
                    if (intersect(Vertexes[i], Vertexes[j], Obstacles[u][v], Obstacles[u][(v + 1) & 3]))
                    {
                        flag = false;
                        break;
                    }
                if (!flag)
                    break;
            }
            Edges[i][j] = Edges[j][i] = (flag ? (Vertexes[i] - Vertexes[j]).length() : FINF);
        }
}